

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int q;
  int iVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  Mat borderm;
  Mat m;
  Mat local_98;
  Mat local_68;
  
  if (right + left == 0 && bottom + top == 0) {
    if (dst != src) {
      piVar2 = src->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      piVar2 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar2;
      dst->elemsize = src->elemsize;
      iVar6 = src->w;
      iVar9 = src->h;
      iVar3 = src->c;
      dst->dims = src->dims;
      dst->w = iVar6;
      dst->h = iVar9;
      dst->c = iVar3;
      dst->cstep = src->cstep;
    }
  }
  else {
    iVar9 = right + left + src->w;
    iVar6 = bottom + top + src->h;
    if (src->dims == 3) {
      uVar1 = src->c;
      auVar11._0_4_ = -(uint)(dst->dims == 3);
      auVar11._4_4_ = -(uint)(iVar9 == dst->w);
      auVar11._8_4_ = -(uint)(iVar6 == dst->h);
      auVar11._12_4_ = -(uint)(uVar1 == dst->c);
      iVar3 = movmskps(3,auVar11);
      if ((iVar3 != 0xf) || (dst->elemsize != 4)) {
        piVar2 = dst->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
            free(*(void **)((long)dst->data + -8));
          }
        }
        dst->elemsize = 0;
        dst->dims = 0;
        dst->w = 0;
        dst->h = 0;
        dst->c = 0;
        dst->cstep = 0;
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        dst->elemsize = 4;
        dst->dims = 3;
        dst->w = iVar9;
        dst->h = iVar6;
        dst->c = uVar1;
        uVar7 = (long)(iVar6 * iVar9) + 3U & 0x3ffffffffffffffc;
        dst->cstep = uVar7;
        lVar8 = uVar7 * (long)(int)uVar1;
        if (lVar8 != 0) {
          pvVar4 = malloc(lVar8 * 4 + 0x1c);
          pvVar5 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar5 - 8) = pvVar4;
          dst->data = pvVar5;
          piVar2 = (int *)((long)pvVar5 + lVar8 * 4);
          dst->refcount = piVar2;
          *piVar2 = 1;
        }
      }
      if ((dst->data != (void *)0x0) && (0 < (int)uVar1 && (long)dst->c * dst->cstep != 0)) {
        uVar7 = 0;
        do {
          local_68.w = src->w;
          local_68.h = src->h;
          local_68.elemsize = src->elemsize;
          local_68.data = (void *)(src->cstep * uVar7 * local_68.elemsize + (long)src->data);
          local_68.refcount = (int *)0x0;
          local_68.dims = 2;
          local_68.c = 1;
          local_68.cstep = (size_t)(local_68.h * local_68.w);
          local_98.w = dst->w;
          local_98.h = dst->h;
          local_98.elemsize = dst->elemsize;
          local_98.data = (void *)(dst->cstep * uVar7 * local_98.elemsize + (long)dst->data);
          local_98.refcount = (int *)0x0;
          local_98.dims = 2;
          local_98.c = 1;
          local_98.cstep = (size_t)(local_98.h * local_98.w);
          copy_make_border_image(&local_68,&local_98,top,left,type,v);
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + -1;
            UNLOCK();
            if ((*local_98.refcount == 0) && (local_98.data != (void *)0x0)) {
              free(*(void **)((long)local_98.data + -8));
            }
          }
          if (local_68.refcount != (int *)0x0) {
            LOCK();
            *local_68.refcount = *local_68.refcount + -1;
            UNLOCK();
            if ((*local_68.refcount == 0) && (local_68.data != (void *)0x0)) {
              free(*(void **)((long)local_68.data + -8));
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
    }
    else if (src->dims == 2) {
      if ((((dst->dims != 2) || (dst->w != iVar9)) || (dst->h != iVar6)) || (dst->elemsize != 4)) {
        piVar2 = dst->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
            free(*(void **)((long)dst->data + -8));
          }
        }
        dst->elemsize = 0;
        dst->dims = 0;
        dst->w = 0;
        dst->h = 0;
        dst->c = 0;
        dst->cstep = 0;
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        dst->elemsize = 4;
        dst->dims = 2;
        dst->w = iVar9;
        dst->h = iVar6;
        dst->c = 1;
        sVar10 = (size_t)(iVar6 * iVar9);
        dst->cstep = sVar10;
        if (iVar6 * iVar9 != 0) {
          pvVar4 = malloc(sVar10 * 4 + 0x1c);
          pvVar5 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar5 - 8) = pvVar4;
          dst->data = pvVar5;
          piVar2 = (int *)((long)pvVar5 + sVar10 * 4);
          dst->refcount = piVar2;
          *piVar2 = 1;
        }
      }
      if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
        copy_make_border_image(src,dst,top,left,type,v);
        return;
      }
    }
  }
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v)
{
    int w = src.w + left + right;
    int h = src.h + top + bottom;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        copy_make_border_image(src, dst, top, left, type, v);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat borderm = dst.channel(q);

            copy_make_border_image(m, borderm, top, left, type, v);
        }
    }
}